

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

bool __thiscall
QArrayDataPointer<QAccessible::ActivationObserver_*>::tryReadjustFreeSpace
          (QArrayDataPointer<QAccessible::ActivationObserver_*> *this,GrowthPosition pos,qsizetype n
          ,ActivationObserver ***data)

{
  qsizetype qVar1;
  qsizetype qVar2;
  qsizetype qVar3;
  long lVar4;
  Promoted<int,_long_long> PVar5;
  QArrayDataPointer<QAccessible::ActivationObserver_*> *in_RDX;
  int in_ESI;
  QArrayDataPointer<QAccessible::ActivationObserver_*> *in_RDI;
  long in_FS_OFFSET;
  qsizetype dataStartOffset;
  qsizetype freeAtEnd;
  qsizetype freeAtBegin;
  qsizetype capacity;
  QArrayDataPointer<QAccessible::ActivationObserver_*> *in_stack_ffffffffffffff90;
  QArrayDataPointer<QAccessible::ActivationObserver_*> *this_00;
  bool local_19;
  long local_18;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar1 = constAllocatedCapacity(in_stack_ffffffffffffff90);
  qVar2 = freeSpaceAtBegin(in_RDI);
  qVar3 = freeSpaceAtEnd(in_RDI);
  this_00 = (QArrayDataPointer<QAccessible::ActivationObserver_*> *)0x0;
  if (((in_ESI != 0) || (qVar2 < (long)in_RDX)) ||
     (lVar4 = in_RDI->size * 3, SBORROW8(lVar4,qVar1 * 2) == lVar4 + qVar1 * -2 < 0)) {
    if (((in_ESI != 1) || (qVar3 < (long)in_RDX)) || (qVar1 <= in_RDI->size * 3)) {
      local_19 = false;
      goto LAB_00961a63;
    }
    local_c = 0;
    local_18 = ((qVar1 - in_RDI->size) - (long)in_RDX) / 2;
    PVar5 = qMax<int,long_long>(&local_c,&local_18);
    this_00 = (QArrayDataPointer<QAccessible::ActivationObserver_*> *)((long)&in_RDX->d + PVar5);
    in_stack_ffffffffffffff90 = in_RDX;
  }
  relocate(this_00,(qsizetype)in_RDI,(ActivationObserver ***)in_stack_ffffffffffffff90);
  local_19 = true;
LAB_00961a63:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_19;
}

Assistant:

bool tryReadjustFreeSpace(QArrayData::GrowthPosition pos, qsizetype n, const T **data = nullptr)
    {
        Q_ASSERT(!this->needsDetach());
        Q_ASSERT(n > 0);
        Q_ASSERT((pos == QArrayData::GrowsAtEnd && this->freeSpaceAtEnd() < n)
                 || (pos == QArrayData::GrowsAtBeginning && this->freeSpaceAtBegin() < n));

        const qsizetype capacity = this->constAllocatedCapacity();
        const qsizetype freeAtBegin = this->freeSpaceAtBegin();
        const qsizetype freeAtEnd = this->freeSpaceAtEnd();

        qsizetype dataStartOffset = 0;
        // algorithm:
        //   a. GrowsAtEnd: relocate if space at begin AND size < (capacity * 2) / 3
        //      [all goes to free space at end]:
        //      new free space at begin = 0
        //
        //   b. GrowsAtBeginning: relocate if space at end AND size < capacity / 3
        //      [balance the free space]:
        //      new free space at begin = n + (total free space - n) / 2
        if (pos == QArrayData::GrowsAtEnd && freeAtBegin >= n
            && ((3 * this->size) < (2 * capacity))) {
            // dataStartOffset = 0; - done in declaration
        } else if (pos == QArrayData::GrowsAtBeginning && freeAtEnd >= n
                   && ((3 * this->size) < capacity)) {
            // total free space == capacity - size
            dataStartOffset = n + qMax(0, (capacity - this->size - n) / 2);
        } else {
            // nothing to do otherwise
            return false;
        }

        relocate(dataStartOffset - freeAtBegin, data);

        Q_ASSERT((pos == QArrayData::GrowsAtEnd && this->freeSpaceAtEnd() >= n)
                 || (pos == QArrayData::GrowsAtBeginning && this->freeSpaceAtBegin() >= n));
        return true;
    }